

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evolution_v2_generated.h
# Opt level: O2

bool __thiscall Evolution::V2::TableA::Verify(TableA *this,Verifier *verifier)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  void *extraout_RDX;
  Verifier *pVVar3;
  
  bVar1 = flatbuffers::VerifierTemplate<false>::VerifyTableStart(verifier,(uint8_t *)this);
  if ((((bVar1) &&
       (bVar1 = flatbuffers::Table::VerifyField<float>(&this->super_Table,verifier,4,4), bVar1)) &&
      (bVar1 = flatbuffers::Table::VerifyField<int>(&this->super_Table,verifier,6,4), bVar1)) &&
     (pVVar3 = verifier,
     bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>(&this->super_Table,verifier,8), bVar1))
  {
    iVar2 = c(this,pVVar3,extraout_RDX);
    bVar1 = flatbuffers::VerifierTemplate<false>::VerifyString
                      (verifier,(String *)CONCAT44(extraout_var,iVar2));
    if (bVar1) {
      verifier->depth_ = verifier->depth_ - 1;
      return true;
    }
  }
  return false;
}

Assistant:

bool Verify(::flatbuffers::Verifier &verifier) const {
    return VerifyTableStart(verifier) &&
           VerifyField<float>(verifier, VT_A, 4) &&
           VerifyField<int32_t>(verifier, VT_B, 4) &&
           VerifyOffset(verifier, VT_C) &&
           verifier.VerifyString(c()) &&
           verifier.EndTable();
  }